

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* dot(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      *__return_storage_ptr__,
     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
     *theta,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *phi)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  uint local_5c;
  int v;
  double thetadk;
  int k;
  int d_1;
  int local_40;
  int d;
  allocator<std::vector<double,_std::allocator<double>_>_> local_2e;
  undefined1 local_2d;
  uint local_2c;
  uint local_28;
  uint V;
  uint K;
  uint D;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *phi_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *theta_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *ret;
  
  _K = phi;
  phi_local = theta;
  theta_local = __return_storage_ptr__;
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(theta);
  V = (uint)sVar3;
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(_K);
  local_28 = (uint)sVar3;
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](_K,0);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar4);
  local_2c = (uint)sVar3;
  local_2d = 0;
  uVar5 = (ulong)V;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_2e);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,uVar5,&local_2e);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_2e);
  for (local_40 = 0; uVar5 = (ulong)local_40,
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(__return_storage_ptr__), uVar5 < sVar3; local_40 = local_40 + 1) {
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](__return_storage_ptr__,(long)local_40);
    _k = 0.0;
    std::vector<double,_std::allocator<double>_>::assign(pvVar6,(ulong)local_2c,(value_type *)&k);
  }
  for (thetadk._4_4_ = 0; thetadk._4_4_ < V; thetadk._4_4_ = thetadk._4_4_ + 1) {
    for (thetadk._0_4_ = 0; thetadk._0_4_ < local_28; thetadk._0_4_ = thetadk._0_4_ + 1) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](phi_local,(long)(int)thetadk._4_4_);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (pvVar4,(long)(int)thetadk._0_4_);
      dVar1 = *pvVar7;
      for (local_5c = 0; local_5c < local_2c; local_5c = local_5c + 1) {
        pvVar4 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](_K,(long)(int)thetadk._0_4_);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar4,(long)(int)local_5c);
        dVar2 = *pvVar7;
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,(long)(int)thetadk._4_4_);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar6,(long)(int)local_5c);
        *pvVar8 = dVar1 * dVar2 + *pvVar8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > dot(const vector<vector<double> > &theta, const vector<vector<double> > &phi){
    unsigned int D=theta.size(), K=phi.size(), V=phi[0].size();
    vector<vector<double> > ret(D);
    for(int d=0; d<ret.size(); d++)ret[d].assign(V,0);
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            double thetadk = theta[d][k];
            for(int v=0; v<V; v++){
                ret[d][v] += thetadk * phi[k][v];
            }
        }
    }
    return ret;
}